

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O2

void Vec_StrPrintStr(Vec_Str_t *p,char *pStr)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  
  sVar1 = strlen(pStr);
  uVar2 = 0;
  uVar3 = sVar1 & 0xffffffff;
  if ((int)sVar1 < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    Vec_StrPush(p,pStr[uVar2]);
  }
  return;
}

Assistant:

static inline void Vec_StrPrintStr( Vec_Str_t * p, const char * pStr )
{
    int i, Length = (int)strlen(pStr);
    for ( i = 0; i < Length; i++ )
        Vec_StrPush( p, pStr[i] );
}